

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O3

void __thiscall Qentem::Tags::TagBit::Clear(TagBit *this)

{
  Array<Qentem::Tags::IfTagCase> *this_00;
  
  switch(this->type_) {
  case Variable:
  case RawVariable:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00124116;
    break;
  case Math:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00124116;
    goto LAB_001240f4;
  case SuperVariable:
  case Loop:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00124116;
    Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)this_00);
    break;
  case InLineIf:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00124116;
    Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)(this_00 + 1));
LAB_001240f4:
    Array<Qentem::QExpression>::~Array((Array<Qentem::QExpression> *)this_00);
    break;
  case If:
    this_00 = (Array<Qentem::Tags::IfTagCase> *)this->storage_;
    if (this_00 == (Array<Qentem::Tags::IfTagCase> *)0x0) goto LAB_00124116;
    Array<Qentem::Tags::IfTagCase>::~Array(this_00);
    break;
  default:
    return;
  }
  MemoryRecord::RemoveAllocation(this_00);
LAB_00124116:
  operator_delete(this_00);
  return;
}

Assistant:

inline TagType GetType() const noexcept {
        return type_;
    }